

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tikz.cc
# Opt level: O0

bool lf::io::writeTikZ(Mesh *mesh,string *filename,TikzOutputCtrl output_ctrl)

{
  bool bVar1;
  PredicateTrue local_41;
  function<bool_(const_lf::mesh::Entity_&)> local_40;
  TikzOutputCtrl local_1c;
  string *psStack_18;
  TikzOutputCtrl output_ctrl_local;
  string *filename_local;
  Mesh *mesh_local;
  
  local_1c = output_ctrl;
  psStack_18 = filename;
  filename_local = (string *)mesh;
  std::function<bool(lf::mesh::Entity_const&)>::function<lf::base::PredicateTrue,void>
            ((function<bool(lf::mesh::Entity_const&)> *)&local_40,&local_41);
  bVar1 = writeTikZ(mesh,filename,&local_40,local_1c);
  std::function<bool_(const_lf::mesh::Entity_&)>::~function(&local_40);
  return bVar1;
}

Assistant:

bool writeTikZ(const lf::mesh::Mesh &mesh, const std::string &filename,
               TikzOutputCtrl output_ctrl) {
  return writeTikZ(mesh, filename, base::PredicateTrue{}, output_ctrl);
}